

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discover.cc
# Opt level: O3

bool __thiscall
rcdiscover::Discover::getResponse
          (Discover *this,
          vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *info,
          int timeout_per_socket)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pfVar2;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result<rcdiscover::DeviceInfo> *this_01;
  pointer *__ptr;
  _State_baseV2 *__tmp;
  bool bVar4;
  pointer pSVar5;
  pointer this_02;
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  futures;
  timeval tv;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  long *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  local_198;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *local_178;
  pointer local_170;
  _func_int **local_168 [2];
  __basic_future<rcdiscover::DeviceInfo> local_158;
  _func_int *local_148;
  long local_140;
  DeviceInfo local_138;
  
  local_148 = (_func_int *)(long)(timeout_per_socket / 1000);
  local_140 = (long)((timeout_per_socket % 1000) * 1000);
  local_198.
  super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (future<rcdiscover::DeviceInfo> *)0x0;
  local_198.
  super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (future<rcdiscover::DeviceInfo> *)0x0;
  local_198.
  super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar5 = (this->sockets_).
           super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_170 = (this->sockets_).
              super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  if (pSVar5 != local_170) {
    local_178 = info;
    do {
      local_138.iface_name._M_dataplus._M_p = (pointer)0x0;
      local_138.iface_name._M_string_length = 0;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      p_Var3->_M_use_count = 1;
      p_Var3->_M_weak_count = 1;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011fac8;
      local_1a0 = p_Var3 + 1;
      p_Var3[1]._M_use_count = 0;
      p_Var3[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var3[2]._M_use_count = 0;
      p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var3[3]._M_use_count = 0;
      p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0011fb18;
      this_01 = (_Result<rcdiscover::DeviceInfo> *)operator_new(0x118);
      std::__future_base::_Result<rcdiscover::DeviceInfo>::_Result(this_01);
      p_Var3[4]._vptr__Sp_counted_base = (_func_int **)this_01;
      *(pointer *)&p_Var3[4]._M_use_count = pSVar5;
      p_Var3[5]._vptr__Sp_counted_base = &local_148;
      *(vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
        **)&p_Var3[5]._M_use_count = &this->req_nums_;
      local_168[0] = (_func_int **)0x0;
      local_1a8 = (long *)operator_new(0x20);
      p_Var1 = local_1a0;
      *local_1a8 = (long)&PTR___State_0011fb70;
      local_1a8[1] = (long)local_1a0;
      local_1a8[2] = (long)std::__future_base::
                           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rcdiscover/rcdiscover/discover.cc:123:54)>_>,_rcdiscover::DeviceInfo>
                           ::_M_run;
      local_1a8[3] = 0;
      std::thread::_M_start_thread(local_168,&local_1a8,0);
      if (local_1a8 != (long *)0x0) {
        (**(code **)(*local_1a8 + 8))();
      }
      if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var3[3]._vptr__Sp_counted_base = local_168[0];
      local_138.iface_name._M_dataplus._M_p = (pointer)p_Var1;
      local_138.iface_name._M_string_length = (size_type)p_Var3;
      std::__basic_future<rcdiscover::DeviceInfo>::__basic_future
                (&local_158,(__state_type *)&local_138);
      this_00 = local_178;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.iface_name._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_138.iface_name._M_string_length);
      }
      std::
      vector<std::future<rcdiscover::DeviceInfo>,std::allocator<std::future<rcdiscover::DeviceInfo>>>
      ::emplace_back<std::future<rcdiscover::DeviceInfo>>
                ((vector<std::future<rcdiscover::DeviceInfo>,std::allocator<std::future<rcdiscover::DeviceInfo>>>
                  *)&local_198,(future<rcdiscover::DeviceInfo> *)&local_158);
      if (local_158._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pfVar2 = local_198.
               super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != local_170);
    bVar4 = false;
    if (local_198.
        super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_198.
        super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_02 = local_198.
                super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::future<rcdiscover::DeviceInfo>::get(&local_138,this_02);
        std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::
        emplace_back<rcdiscover::DeviceInfo>(this_00,&local_138);
        DeviceInfo::~DeviceInfo(&local_138);
        bVar4 = (bool)(bVar4 | (this_00->
                               super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                               )._M_impl.super__Vector_impl_data._M_finish[-1].mac != 0);
        this_02 = this_02 + 1;
      } while (this_02 != pfVar2);
    }
  }
  std::
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ::~vector(&local_198);
  return bVar4;
}

Assistant:

bool Discover::getResponse(std::vector<DeviceInfo> &info,
                           int timeout_per_socket)
{
  // setup waiting for data to arrive

  struct timeval tv;
  tv.tv_sec=timeout_per_socket/1000;
  tv.tv_usec=(timeout_per_socket%1000)*1000;

  // try to get a valid package (repeat if an invalid package is received)

  const auto &req_nums = req_nums_;

  std::vector<std::future<DeviceInfo>> futures;
  for (auto &socket : sockets_)
  {
    futures.push_back(std::async(std::launch::async, [&socket, &tv, &req_nums]
    {
      DeviceInfo device_info(socket.getIfaceName());
      device_info.clear();

      int count = 10;

      auto sock = socket.getHandle<typename SocketType::SocketType>();

      fd_set fds;
      FD_ZERO(&fds);
      FD_SET(sock, &fds);

      while (!device_info.isValid() && count > 0)
      {
        count--;

        if (select(static_cast<int>(sock+1), &fds, NULL, NULL, &tv) > 0)
        {
          // get package

          uint8_t p[600];

          struct sockaddr_in addr;
#ifdef WIN32
          int naddr = sizeof(addr);
#else
          socklen_t naddr = sizeof(addr);
#endif
          memset(&addr, 0, naddr);

          long n = recvfrom(sock,
                            reinterpret_cast<char *>(p), sizeof(p), 0,
                            reinterpret_cast<struct sockaddr *>(&addr), &naddr);

          // check if received package is a valid discovery acknowledge

          if (n >= 8)
          {
            if (p[0] == 0 && p[1] == 0 && p[2] == 0 &&
                p[3] == 0x03)
            {
              if (std::find(req_nums.begin(), req_nums.end(),
                            std::make_tuple(p[6], p[7])) != req_nums.end())
              {
                size_t len=(static_cast<size_t>(p[4])<<8)|p[5];

                if (static_cast<size_t>(n) >= len+8)
                {
                  // extract information and store in list

                  device_info.set(p+8, len);
                }
              }
            }
          }
        }
        else
        {
          count=0;
        }
      }

      return device_info;
    }));

  }

  bool ret = false;
  for (auto &f : futures)
  {
    info.push_back(f.get());
    ret |= info.back().isValid();
  }

  return ret;
}